

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void __thiscall glslang::TBuiltInParseables::TBuiltInParseables(TBuiltInParseables *this)

{
  TPoolAllocator *pTVar1;
  long lVar2;
  
  this->_vptr_TBuiltInParseables = (_func_int **)&PTR__TBuiltIns_00b0e660;
  pTVar1 = GetThreadPoolAllocator();
  (this->commonBuiltins)._M_dataplus.super_allocator_type.allocator = pTVar1;
  (this->commonBuiltins)._M_dataplus._M_p = (pointer)&(this->commonBuiltins).field_2;
  (this->commonBuiltins)._M_string_length = 0;
  (this->commonBuiltins).field_2._M_local_buf[0] = '\0';
  lVar2 = 0x48;
  do {
    pTVar1 = GetThreadPoolAllocator();
    *(TPoolAllocator **)((long)this->stageBuiltins + lVar2 + -0x48) = pTVar1;
    *(long *)((long)this->stageBuiltins + lVar2 + -0x40) = (long)this->stageBuiltins + lVar2 + -0x30
    ;
    *(undefined8 *)((long)this->stageBuiltins + lVar2 + -0x38) = 0;
    *(undefined1 *)((long)this->stageBuiltins + lVar2 + -0x30) = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x278);
  return;
}

Assistant:

TBuiltInParseables::TBuiltInParseables()
{
}